

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom,REF_INT geom,REF_DBL *delta_radian)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  REF_ADJ pRVar4;
  bool bVar5;
  ulong uVar6;
  REF_ADJ_ITEM pRVar7;
  REF_DBL RVar8;
  REF_DBL RVar9;
  double dVar10;
  
  if (ref_geom->face_seg_per_rad != (REF_DBL *)0x0) {
    pRVar3 = ref_geom->descr;
    iVar1 = pRVar3[(long)(geom * 6) + 5];
    if (((-1 < (long)iVar1) && (pRVar4 = ref_geom->ref_adj, iVar1 < pRVar4->nnode)) &&
       (uVar6 = (ulong)pRVar4->first[iVar1], uVar6 != 0xffffffffffffffff)) {
      pRVar7 = pRVar4->item + uVar6;
      RVar8 = 0.0;
      bVar5 = false;
      RVar9 = 100.0;
      do {
        if ((pRVar3[(long)pRVar7->ref * 6] != 2) ||
           (dVar10 = ref_geom->face_seg_per_rad[(long)pRVar3[(int)(pRVar7->ref * 6 | 1)] + -1],
           dVar10 < -998.0)) {
          pRVar7 = ref_geom->ref_adj->item;
          uVar2 = pRVar7[(int)uVar6].next;
          if (uVar2 == 0xffffffff) goto LAB_001350ba;
        }
        else {
          if (dVar10 <= 0.01) goto LAB_00135108;
          if (RVar8 <= dVar10) {
            RVar8 = dVar10;
          }
          pRVar7 = ref_geom->ref_adj->item;
          uVar2 = pRVar7[(int)uVar6].next;
          bVar5 = true;
          if (uVar2 == 0xffffffff) goto LAB_001350c4;
        }
        uVar6 = (ulong)uVar2;
        pRVar7 = pRVar7 + (int)uVar2;
      } while( true );
    }
  }
LAB_001350bf:
  RVar8 = ref_geom->segments_per_radian_of_curvature;
LAB_001350c4:
  RVar9 = 100.0;
  if (0.1 < RVar8) {
    dVar10 = RVar8 * 1e+20;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    if (1.0 < dVar10) {
      RVar9 = 1.0 / RVar8;
    }
  }
LAB_00135108:
  *delta_radian = RVar9;
  return 0;
LAB_001350ba:
  if (bVar5) goto LAB_001350c4;
  goto LAB_001350bf;
}

Assistant:

REF_FCN REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom, REF_INT geom,
                                           REF_DBL *delta_radian) {
  REF_INT node, item, face_geom, face;
  REF_DBL segments, face_segments;
  REF_DBL face_set = -998.0;
  REF_DBL face_active = 0.01;
  REF_BOOL turn_off, use_face;
  use_face = REF_FALSE;
  turn_off = REF_FALSE;

  segments = 0.0;

  if (NULL != (ref_geom)->face_seg_per_rad) {
    node = ref_geom_node(ref_geom, geom);
    each_ref_geom_having_node(ref_geom, node, item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
        face = ref_geom_id(ref_geom, face_geom) - 1;
        face_segments = ref_geom->face_seg_per_rad[face];
        if (face_segments < face_set) continue;
        if (face_segments > face_active) {
          segments = MAX(segments, face_segments);
          use_face = REF_TRUE;
        } else {
          turn_off = REF_TRUE;
          break;
        }
      }
    }
  }

  if (turn_off) {
    *delta_radian = 100.0;
    return REF_SUCCESS;
  }

  if (!use_face) {
    segments = ref_geom_segments_per_radian_of_curvature(ref_geom);
  }

  if (segments > 0.1 && ref_math_divisible(1.0, segments)) {
    *delta_radian = 1.0 / segments;
  } else {
    *delta_radian = 100.0;
  }

  return REF_SUCCESS;
}